

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O0

void __thiscall QHttpNetworkConnectionPrivate::fillHttp2Queue(QHttpNetworkConnectionPrivate *this)

{
  bool bVar1;
  int *key;
  iterator o;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *value;
  QHttpNetworkReplyPrivate *pQVar2;
  long in_RDI;
  long in_FS_OFFSET;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *pair_1;
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *__range1_1;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *pair;
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *__range1;
  iterator __end1_1;
  iterator __begin1_1;
  iterator __end1;
  iterator __begin1;
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *in_stack_ffffffffffffff70;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  iterator in_stack_ffffffffffffff98;
  iterator local_30;
  undefined4 local_24;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *local_20;
  iterator local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0xaaaaaaaaaaaaaaaa;
  local_10 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::begin
                       (in_stack_ffffffffffffff70);
  local_18.i = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0xaaaaaaaaaaaaaaaa;
  local_18 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end
                       (in_stack_ffffffffffffff70);
  while( true ) {
    local_20 = local_18.i;
    bVar1 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::iterator::operator!=
                      (&local_10,local_18);
    if (!bVar1) break;
    QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::iterator::operator*(&local_10);
    pQVar2 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2ee4ce);
    if ((pQVar2->requestIsPrepared & 1U) == 0) {
      prepareRequest((QHttpNetworkConnectionPrivate *)__range1_1,pair_1);
    }
    local_24 = 0;
    in_stack_ffffffffffffff98._M_node =
         (_Base_ptr)
         QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::insert
                   (in_stack_ffffffffffffff98._M_node,in_stack_ffffffffffffff90,
                    in_stack_ffffffffffffff88);
    QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::iterator::operator++(&local_10);
  }
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::clear(in_stack_ffffffffffffff70);
  key = (int *)(in_RDI + 0xe0);
  local_30.i = (pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)0xaaaaaaaaaaaaaaaa;
  local_30 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::begin
                       (in_stack_ffffffffffffff70);
  o = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end(in_stack_ffffffffffffff70);
  while( true ) {
    bVar1 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::iterator::operator!=
                      (&local_30,o);
    if (!bVar1) break;
    value = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::iterator::operator*
                      (&local_30);
    pQVar2 = QHttpNetworkReply::d_func((QHttpNetworkReply *)0x2ee5db);
    if ((pQVar2->requestIsPrepared & 1U) == 0) {
      prepareRequest((QHttpNetworkConnectionPrivate *)__range1_1,pair_1);
    }
    in_stack_ffffffffffffff70 =
         (QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
         (*(long *)(in_RDI + 0xb8) + 0x80);
    QHttpNetworkRequest::priority((QHttpNetworkRequest *)0x2ee614);
    QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::insert
              ((QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
               in_stack_ffffffffffffff98._M_node,key,value);
    QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::iterator::operator++(&local_30);
  }
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::clear(in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionPrivate::fillHttp2Queue()
{
    for (auto &pair : highPriorityQueue) {
        if (!pair.second->d_func()->requestIsPrepared)
            prepareRequest(pair);
        channels[0].h2RequestsToSend.insert(QHttpNetworkRequest::HighPriority, pair);
    }

    highPriorityQueue.clear();

    for (auto &pair : lowPriorityQueue) {
        if (!pair.second->d_func()->requestIsPrepared)
            prepareRequest(pair);
        channels[0].h2RequestsToSend.insert(pair.first.priority(), pair);
    }

    lowPriorityQueue.clear();
}